

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

void __thiscall
CVmObjVector::insert_elements_undo(CVmObjVector *this,vm_obj_id_t self,int ins_idx,int add_cnt)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int in_ECX;
  int in_EDX;
  CVmObjVector *in_RDI;
  int new_idx;
  vm_val_t ele;
  int idx;
  int new_cnt;
  int old_cnt;
  size_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  vm_obj_id_t in_stack_ffffffffffffffdc;
  int iVar4;
  
  sVar3 = get_element_count((CVmObjVector *)0x34fc84);
  iVar1 = (int)sVar3;
  iVar2 = iVar1 + in_ECX;
  set_element_count_undo(this,self,CONCAT44(add_cnt,old_cnt));
  iVar4 = iVar1;
  if (in_EDX < iVar1) {
    while (iVar4 = iVar4 + -1, in_EDX <= iVar4) {
      get_element(in_RDI,in_stack_ffffffffffffffb8,(vm_val_t *)0x34fcda);
      if (iVar4 + in_ECX < iVar1) {
        set_element_undo((CVmObjVector *)CONCAT44(iVar2,iVar4),in_stack_ffffffffffffffdc,
                         in_stack_ffffffffffffffd0,
                         (vm_val_t *)CONCAT44(iVar4 + in_ECX,in_stack_ffffffffffffffc8));
      }
      else {
        set_element(in_RDI,in_stack_ffffffffffffffb8,(vm_val_t *)0x34fd1e);
      }
    }
  }
  return;
}

Assistant:

void CVmObjVector::insert_elements_undo(VMG_ vm_obj_id_t self,
                                        int ins_idx, int add_cnt)
{
    /* note the new and old sizes */
    int old_cnt = get_element_count();
    int new_cnt = old_cnt + add_cnt;

    /* create the new elements */
    set_element_count_undo(vmg_ self, new_cnt);

    /* 
     *   Move the existing elements to their new slots.  Start with the
     *   starting index, and move it to its new position, since the starting
     *   index is the first element that needs to be moved.  Note that we
     *   start at the top and work down, to avoid overwriting any overlapping
     *   part of the new position block and the old position block.
     *   
     *   If we're inserting after the last element, there's no moving that
     *   needs to be done.  
     */
    if (ins_idx < old_cnt)
    {
        for (int idx = old_cnt - 1 ; idx >= ins_idx ; --idx)
        {
            /* get the value at this slot */
            vm_val_t ele;
            get_element(idx, &ele);

            /* calculate the new slot */
            int new_idx = idx + add_cnt;

            /* 
             *   if the new index is within the old size range, keep undo for
             *   the change; otherwise, no undo is necessary, since when we
             *   undo we'll be completely dropping this new slot 
             */
            if (new_idx < old_cnt)
                set_element_undo(vmg_ self, new_idx, &ele);
            else
                set_element(new_idx, &ele);
        }
    }
}